

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O0

sexp_conflict
sexp_file_lock_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,
                   sexp_conflict arg1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  sexp_conflict res;
  int err;
  ulong local_78;
  ulong local_70;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  sexp_conflict local_40;
  sexp_conflict local_8;
  
  if ((((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x10)) ||
      ((((ulong)in_RCX & 3) == 0 && (*in_RCX == 0x11)))) ||
     (((((ulong)in_RCX & 3) == 0 && (*in_RCX == 0x12)) || (((ulong)in_RCX & 1) == 1)))) {
    if ((((ulong)in_R8 & 1) == 1) || ((((ulong)in_R8 & 3) == 0 && (*in_R8 == 0xc)))) {
      if (((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x10)) ||
         ((((ulong)in_RCX & 3) == 0 && (*in_RCX == 0x11)))) {
        if (*(long *)(in_RCX + 8) == 0) {
          if (((*(ulong *)(in_RCX + 6) & 3) == 0) && (**(int **)(in_RCX + 6) == 0x12)) {
            local_50 = *(ulong *)(*(long *)(in_RCX + 6) + 0x10);
          }
          else {
            local_50 = 0xffffffffffffffff;
          }
          local_48 = local_50;
        }
        else {
          iVar3 = fileno(*(FILE **)(in_RCX + 8));
          local_48 = (ulong)iVar3;
        }
        local_58 = local_48;
      }
      else {
        if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x12)) {
          local_60 = *(ulong *)(in_RCX + 4);
        }
        else {
          auVar1._8_8_ = (long)in_RCX >> 0x3f;
          auVar1._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe;
          local_60 = SUB168(auVar1 / SEXT816(2),0);
        }
        local_58 = local_60;
      }
      if (((ulong)in_R8 & 1) == 1) {
        auVar2._8_8_ = (long)in_R8 >> 0x3f;
        auVar2._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
        local_70 = SUB168(auVar2 / SEXT816(2),0);
      }
      else {
        if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0xc)) {
          local_78 = (long)(char)in_R8[2] * *(long *)(in_R8 + 6);
        }
        else {
          local_78 = 0;
        }
        local_70 = local_78;
      }
      iVar3 = flock(local_58 & 0xffffffff,local_70 & 0xffffffff);
      if (iVar3 == 0) {
        local_40 = (sexp_conflict)0x13e;
      }
      else {
        local_40 = (sexp_conflict)0x3e;
      }
      local_8 = local_40;
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
  }
  else {
    local_8 = (sexp_conflict)
              sexp_xtype_exception(in_RDI,in_RSI,"not a port or file descriptor",in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_file_lock_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  int err = 0;
  sexp res;
  if (! (sexp_portp(arg0) || sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_xtype_exception(ctx, self, "not a port or file descriptor",arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  err = flock((sexp_portp(arg0) ? sexp_port_fileno(arg0) : sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)), sexp_sint_value(arg1));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}